

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawset(lua_State *L,int idx)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *io1;
  TValue *io2;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,idx);
  pTVar1 = L->top;
  pTVar3 = luaH_set(L,&((pTVar2->value_).gc)->h,L->top + -2);
  pTVar3->value_ = pTVar1[-1].value_;
  pTVar3->tt_ = pTVar1[-1].tt_;
  (pTVar2->value_).f[10] = (code)0x0;
  if ((((L->top[-1].tt_ & 0x40U) != 0) && (((byte)L->top[-1].value_.f[9] & 3) != 0)) &&
     (((byte)(pTVar2->value_).f[9] & 4) != 0)) {
    luaC_barrierback_(L,(pTVar2->value_).gc);
  }
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_rawset (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setobj2t(L, luaH_set(L, hvalue(t), L->top-2), L->top-1);
  invalidateTMcache(hvalue(t));
  luaC_barrierback(L, gcvalue(t), L->top-1);
  L->top -= 2;
  lua_unlock(L);
}